

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

If * wasm::anon_unknown_18::FunctionSplitter::getIf(Expression *curr,Index i)

{
  Expression *this;
  If *iff;
  Expression *item;
  Index i_local;
  Expression *curr_local;
  
  this = getItem(curr,i);
  if (this == (Expression *)0x0) {
    curr_local = (Expression *)0x0;
  }
  else {
    curr_local = (Expression *)Expression::dynCast<wasm::If>(this);
    if ((If *)curr_local == (If *)0x0) {
      curr_local = (Expression *)0x0;
    }
  }
  return (If *)curr_local;
}

Assistant:

static If* getIf(Expression* curr, Index i = 0) {
    auto* item = getItem(curr, i);
    if (!item) {
      return nullptr;
    }
    if (auto* iff = item->dynCast<If>()) {
      return iff;
    }
    return nullptr;
  }